

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O1

int dump_indent(size_t flags,int depth,int space,json_dump_callback_t dump,void *data)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  if ((flags & 0x1f) == 0) {
    if ((char)(((uint)flags & 0x20) >> 5) == '\0' && space != 0) {
      iVar1 = (*dump)(" ",1,data);
      return iVar1;
    }
LAB_00104778:
    iVar2 = 0;
  }
  else {
    iVar1 = (*dump)("\n",1,data);
    iVar2 = -1;
    if (iVar1 == 0) {
      uVar3 = (int)(flags & 0x1f) * depth;
      do {
        if (uVar3 == 0) goto LAB_00104778;
        uVar4 = 0x20;
        if (uVar3 < 0x20) {
          uVar4 = uVar3;
        }
        iVar1 = (*dump)("                                ",(size_t)uVar4,data);
        if (iVar1 != 0) {
          uVar4 = 0;
        }
        uVar3 = uVar3 - uVar4;
      } while (iVar1 == 0);
    }
  }
  return iVar2;
}

Assistant:

static int dump_indent(size_t flags, int depth, int space, json_dump_callback_t dump, void *data)
{
	if (FLAGS_TO_INDENT(flags) > 0)
	{
		unsigned int ws_count = FLAGS_TO_INDENT(flags), n_spaces = depth * ws_count;

		if (dump("\n", 1, data))
			return -1;

		while (n_spaces > 0)
		{
			int cur_n = n_spaces < sizeof whitespace - 1 ? n_spaces : sizeof whitespace - 1;

			if (dump(whitespace, cur_n, data))
				return -1;

			n_spaces -= cur_n;
		}
	}
	else if (space && !(flags & JSON_COMPACT))
	{
		return dump(" ", 1, data);
	}
	return 0;
}